

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O0

void re2c::Skeleton::emit_epilog
               (OutputFile *o,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *names)

{
  bool bVar1;
  OutputFile *pOVar2;
  reference s;
  _Self local_28;
  _Self local_20;
  const_iterator i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names_local;
  OutputFile *o_local;
  
  i._M_node = (_Base_ptr)names;
  pOVar2 = OutputFile::ws(o,"\n");
  OutputFile::ws(pOVar2,"int main()");
  pOVar2 = OutputFile::ws(o,"\n");
  OutputFile::ws(pOVar2,"{");
  local_20._M_node =
       (_Base_ptr)
       std::
       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(i._M_node);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(i._M_node);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pOVar2 = OutputFile::ws(o,"\n");
    pOVar2 = OutputFile::wind(pOVar2,1);
    pOVar2 = OutputFile::ws(pOVar2,"if(lex_");
    s = std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&local_20);
    pOVar2 = OutputFile::wstring(pOVar2,s);
    OutputFile::ws(pOVar2,"() != 0) {");
    pOVar2 = OutputFile::ws(o,"\n");
    pOVar2 = OutputFile::wind(pOVar2,2);
    OutputFile::ws(pOVar2,"return 1;");
    pOVar2 = OutputFile::ws(o,"\n");
    pOVar2 = OutputFile::wind(pOVar2,1);
    OutputFile::ws(pOVar2,"}");
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20);
  }
  pOVar2 = OutputFile::ws(o,"\n");
  pOVar2 = OutputFile::wind(pOVar2,1);
  OutputFile::ws(pOVar2,"return 0;");
  OutputFile::ws(o,"\n}");
  OutputFile::ws(o,"\n");
  return;
}

Assistant:

void Skeleton::emit_epilog (OutputFile & o, const std::set<std::string> & names)
{
	o.ws("\n").ws("int main()");
	o.ws("\n").ws("{");

	for (std::set<std::string>::const_iterator i = names.begin (); i != names.end (); ++i)
	{
		o.ws("\n").wind(1).ws("if(lex_").wstring(*i).ws("() != 0) {");
		o.ws("\n").wind(2).ws("return 1;");
		o.ws("\n").wind(1).ws("}");
	}

	o.ws("\n").wind(1).ws("return 0;");
	o.ws("\n}");
	o.ws("\n");
}